

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int fprintHTML(FILE *f,SXML_CHAR *str)

{
  int local_28;
  int local_24;
  int n;
  int i;
  SXML_CHAR *p;
  SXML_CHAR *str_local;
  FILE *f_local;
  
  local_28 = 0;
  _n = str;
  do {
    if (*_n == '\0') {
      return local_28;
    }
    local_24 = 0;
    while (HTML_SPECIAL_DICT[local_24].chr != '\0') {
      if (*_n == HTML_SPECIAL_DICT[local_24].chr) {
        if (f != (FILE *)0x0) {
          fputs(HTML_SPECIAL_DICT[local_24].html,(FILE *)f);
        }
        local_28 = HTML_SPECIAL_DICT[local_24].html_len + local_28;
        break;
      }
      local_24 = local_24 + 1;
    }
    if (HTML_SPECIAL_DICT[local_24].chr == '\0') {
      if (f != (FILE *)0x0) {
        fputc((int)*_n,(FILE *)f);
      }
      local_28 = local_28 + 1;
    }
    _n = _n + 1;
  } while( true );
}

Assistant:

int fprintHTML(FILE* f, SXML_CHAR* str)
{
	SXML_CHAR* p;
	int i, n;
	
	for (p = str, n = 0; *p != NULC; p++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*p != HTML_SPECIAL_DICT[i].chr)
				continue;
			if (f != NULL)
				sx_fputs(HTML_SPECIAL_DICT[i].html, f);
			n += HTML_SPECIAL_DICT[i].html_len;
			break;
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC) {
			if (f != NULL)
				(void)sx_fputc(*p, f);
			n++;
		}
	}
	
	return n;
}